

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_test_cmd_init(MpiDecTestCmd *cmd,int argc,char **argv)

{
  MPP_RET MVar1;
  FileReaderImpl *impl;
  long lVar2;
  MppOpt opts;
  MppOpt local_38;
  
  local_38 = (MppOpt)0x0;
  MVar1 = MPP_NOK;
  if (cmd != (MpiDecTestCmd *)0x0 && 1 < argc) {
    mpp_opt_init(&local_38);
    mpp_opt_setup(local_38,cmd);
    lVar2 = 0;
    do {
      mpp_opt_add(local_38,(MppOptInfo *)((long)&dec_opts[0].name + lVar2));
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0x180);
    mpp_opt_add(local_38,(MppOptInfo *)0x0);
    MVar1 = mpp_opt_parse(local_38,argc,argv);
    if (cmd->have_input != 0) {
      reader_init(&cmd->reader,cmd->file_input,cmd->type);
      if (cmd->reader != (FileReader)0x0) {
        _mpp_log_l(4,"mpi_dec_utils","input file %s size %ld\n",0,cmd,
                   *(undefined8 *)((long)cmd->reader + 8));
      }
    }
    if (cmd->trace_fps != 0) {
      fps_calc_init(&cmd->fps);
      if (cmd->fps == (FpsCalc)0x0) {
        _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"cmd->fps",
                   "mpi_dec_test_cmd_init",0x2cc);
        if ((DAT_00117343 & 0x10) != 0) {
          abort();
        }
      }
      fps_calc_set_cb(cmd->fps,show_dec_fps);
    }
  }
  if (local_38 != (MppOpt)0x0) {
    mpp_opt_deinit(local_38);
    local_38 = (MppOpt)0x0;
  }
  if (MVar1 != MPP_OK) {
    mpi_dec_show_help(*argv);
  }
  return MVar1;
}

Assistant:

RK_S32 mpi_dec_test_cmd_init(MpiDecTestCmd* cmd, int argc, char **argv)
{
    MppOpt opts = NULL;
    RK_S32 ret = -1;
    RK_U32 i;

    if ((argc < 2) || (cmd == NULL))
        goto done;

    mpp_opt_init(&opts);
    /* should change node count when option increases */
    mpp_opt_setup(opts, cmd);

    for (i = 0; i < dec_opt_cnt; i++)
        mpp_opt_add(opts, &dec_opts[i]);

    /* mark option end */
    mpp_opt_add(opts, NULL);

    ret = mpp_opt_parse(opts, argc, argv);

    if (cmd->have_input) {
        reader_init(&cmd->reader, cmd->file_input, cmd->type);
        if (cmd->reader)
            mpp_log("input file %s size %ld\n", cmd->file_input, reader_size(cmd->reader));
    }
    if (cmd->trace_fps) {
        fps_calc_init(&cmd->fps);
        mpp_assert(cmd->fps);
        fps_calc_set_cb(cmd->fps, show_dec_fps);
    }

done:
    if (opts) {
        mpp_opt_deinit(opts);
        opts = NULL;
    }

    if (ret)
        mpi_dec_show_help(argv[0]);

    return ret;
}